

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<double,int>(uint length,double value)

{
  bool bVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  shared_ptr<double> pt;
  shared_ptr<int> pu;
  
  uVar8 = (long)(int)length * 8;
  if ((int)length < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  uVar9 = (long)(int)length * 4;
  if ((int)length < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pdVar2 = (double *)operator_new__(uVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pdVar2,nosimd::common::free<double>);
  pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<int>);
  pdVar4 = pdVar2;
  uVar7 = length;
  uVar6 = length;
  if (7 < (int)length) {
    do {
      *pdVar4 = value;
      pdVar4[1] = value;
      pdVar4[2] = value;
      pdVar4[3] = value;
      pdVar4[4] = value;
      pdVar4[5] = value;
      pdVar4[6] = value;
      pdVar4[7] = value;
      uVar6 = uVar7 - 8;
      pdVar4 = pdVar4 + 8;
      bVar1 = 0xf < (int)uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  if (3 < (int)uVar6) {
    *pdVar4 = value;
    pdVar4[1] = value;
    pdVar4[2] = value;
    pdVar4[3] = value;
    uVar6 = uVar6 - 4;
    pdVar4 = pdVar4 + 4;
  }
  if (1 < (int)uVar6) {
    *pdVar4 = value;
    pdVar4[1] = value;
    uVar6 = uVar6 - 2;
    pdVar4 = pdVar4 + 2;
  }
  if (uVar6 != 0) {
    *pdVar4 = value;
  }
  if (0 < (int)length) {
    uVar8 = 0;
    do {
      *(int *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + uVar8 * 4) = (int)pdVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (length != uVar8);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(int *)((long)&(pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar5 * 4) != (int)value) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = double, _U = int]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}